

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5ExprFunction(sqlite3_context *pCtx,int nArg,sqlite3_value **apVal,int bTcl)

{
  Fts5ExprNode *pExpr_00;
  Fts5Config *pConfig_00;
  int errCode;
  char **azArg;
  uchar *puVar1;
  char *pcVar2;
  Fts5ExprNode *pExpr_01;
  uint uVar3;
  ulong uVar4;
  uint nArg_00;
  char **ppcVar5;
  char *local_68;
  Fts5Config *pConfig;
  Fts5Expr *pExpr;
  int local_4c;
  Fts5Config *local_48;
  sqlite3 *local_40;
  Fts5Global *local_38;
  
  local_38 = (Fts5Global *)pCtx->pFunc->pUserData;
  local_40 = pCtx->pOut->db;
  local_68 = (char *)0x0;
  pExpr = (Fts5Expr *)0x0;
  pConfig = (Fts5Config *)0x0;
  if (nArg < 1) {
    pcVar2 = "fts5_expr_tcl";
    if (bTcl == 0) {
      pcVar2 = "fts5_expr";
    }
    pcVar2 = sqlite3_mprintf("wrong number of arguments to function %s",pcVar2);
    sqlite3_result_error(pCtx,pcVar2,-1);
    sqlite3_free(pcVar2);
    return;
  }
  if (nArg == 1 || bTcl == 0) {
    uVar3 = 1;
    local_48 = (Fts5Config *)0x1efe6b;
  }
  else {
    local_48 = (Fts5Config *)sqlite3_value_text(apVal[1]);
    uVar3 = 2;
  }
  nArg_00 = (nArg - uVar3) + 3;
  azArg = (char **)sqlite3_malloc64((ulong)nArg_00 * 8);
  if (azArg == (char **)0x0) {
    sqlite3_result_error_nomem(pCtx);
    return;
  }
  *azArg = (char *)0x0;
  azArg[1] = "main";
  azArg[2] = "tbl";
  ppcVar5 = azArg + 3;
  local_4c = bTcl;
  for (uVar4 = (ulong)uVar3; uVar4 < (uint)nArg; uVar4 = uVar4 + 1) {
    puVar1 = sqlite3_value_text(apVal[uVar4]);
    *ppcVar5 = (char *)puVar1;
    ppcVar5 = ppcVar5 + 1;
  }
  puVar1 = sqlite3_value_text(*apVal);
  errCode = sqlite3Fts5ConfigParse(local_38,local_40,nArg_00,azArg,&pConfig,&local_68);
  pConfig_00 = pConfig;
  if (errCode == 0) {
    errCode = sqlite3Fts5ExprNew(pConfig,pConfig->nCol,(char *)puVar1,&pExpr,&local_68);
    if (errCode != 0) goto LAB_001ac9b6;
    pExpr_00 = pExpr->pRoot;
    if (pExpr_00->xNext == (_func_int_Fts5Expr_ptr_Fts5ExprNode_ptr_int_i64 *)0x0) {
      pcVar2 = sqlite3_mprintf("");
    }
    else if (local_4c == 0) {
      pcVar2 = fts5ExprPrint(pConfig_00,pExpr_00);
    }
    else {
      pcVar2 = fts5ExprPrintTcl(local_48,(char *)pExpr_00,pExpr_01);
    }
    if (pcVar2 == (char *)0x0) {
      errCode = 7;
      goto LAB_001ac9b6;
    }
    sqlite3_result_text(pCtx,pcVar2,-1,(_func_void_void_ptr *)0xffffffffffffffff);
  }
  else {
LAB_001ac9b6:
    if (local_68 == (char *)0x0) {
      sqlite3_result_error_code(pCtx,errCode);
      goto LAB_001ac9fd;
    }
    sqlite3_result_error(pCtx,local_68,-1);
    pcVar2 = local_68;
  }
  sqlite3_free(pcVar2);
LAB_001ac9fd:
  sqlite3_free(azArg);
  sqlite3Fts5ConfigFree(pConfig);
  sqlite3Fts5ExprFree(pExpr);
  return;
}

Assistant:

static void fts5ExprFunction(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args */
  sqlite3_value **apVal,          /* Function arguments */
  int bTcl
){
  Fts5Global *pGlobal = (Fts5Global*)sqlite3_user_data(pCtx);
  sqlite3 *db = sqlite3_context_db_handle(pCtx);
  const char *zExpr = 0;
  char *zErr = 0;
  Fts5Expr *pExpr = 0;
  int rc;
  int i;

  const char **azConfig;          /* Array of arguments for Fts5Config */
  const char *zNearsetCmd = "nearset";
  int nConfig;                    /* Size of azConfig[] */
  Fts5Config *pConfig = 0;
  int iArg = 1;

  if( nArg<1 ){
    zErr = sqlite3_mprintf("wrong number of arguments to function %s",
        bTcl ? "fts5_expr_tcl" : "fts5_expr"
    );
    sqlite3_result_error(pCtx, zErr, -1);
    sqlite3_free(zErr);
    return;
  }

  if( bTcl && nArg>1 ){
    zNearsetCmd = (const char*)sqlite3_value_text(apVal[1]);
    iArg = 2;
  }

  nConfig = 3 + (nArg-iArg);
  azConfig = (const char**)sqlite3_malloc64(sizeof(char*) * nConfig);
  if( azConfig==0 ){
    sqlite3_result_error_nomem(pCtx);
    return;
  }
  azConfig[0] = 0;
  azConfig[1] = "main";
  azConfig[2] = "tbl";
  for(i=3; iArg<nArg; iArg++){
    azConfig[i++] = (const char*)sqlite3_value_text(apVal[iArg]);
  }

  zExpr = (const char*)sqlite3_value_text(apVal[0]);

  rc = sqlite3Fts5ConfigParse(pGlobal, db, nConfig, azConfig, &pConfig, &zErr);
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5ExprNew(pConfig, pConfig->nCol, zExpr, &pExpr, &zErr);
  }
  if( rc==SQLITE_OK ){
    char *zText;
    if( pExpr->pRoot->xNext==0 ){
      zText = sqlite3_mprintf("");
    }else if( bTcl ){
      zText = fts5ExprPrintTcl(pConfig, zNearsetCmd, pExpr->pRoot);
    }else{
      zText = fts5ExprPrint(pConfig, pExpr->pRoot);
    }
    if( zText==0 ){
      rc = SQLITE_NOMEM;
    }else{
      sqlite3_result_text(pCtx, zText, -1, SQLITE_TRANSIENT);
      sqlite3_free(zText);
    }
  }

  if( rc!=SQLITE_OK ){
    if( zErr ){
      sqlite3_result_error(pCtx, zErr, -1);
      sqlite3_free(zErr);
    }else{
      sqlite3_result_error_code(pCtx, rc);
    }
  }
  sqlite3_free((void *)azConfig);
  sqlite3Fts5ConfigFree(pConfig);
  sqlite3Fts5ExprFree(pExpr);
}